

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_value.c
# Opt level: O3

void * metacall_value_cast_object(void **v)

{
  type_id tVar1;
  void *v_00;
  object poVar2;
  undefined8 unaff_RBX;
  type_id id;
  value in_stack_00000008;
  
  id = (type_id)((ulong)unaff_RBX >> 0x20);
  tVar1 = value_type_id(*v);
  v_00 = *v;
  if (tVar1 != 0x10) {
    v_00 = value_type_cast(in_stack_00000008,id);
    if (v_00 == (value)0x0) {
      v_00 = *v;
    }
    else {
      *v = v_00;
    }
  }
  poVar2 = value_to_object(v_00);
  return poVar2;
}

Assistant:

void *metacall_value_cast_object(void **v)
{
	if (value_type_id(*v) != TYPE_OBJECT)
	{
		value v_cast = value_type_cast(*v, TYPE_OBJECT);

		if (v_cast != NULL)
		{
			*v = v_cast;
		}
	}

	return value_to_object(*v);
}